

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  undefined1 *puVar1;
  int *piVar2;
  curl_off_t *pcVar3;
  ushort uVar4;
  uint uVar5;
  curlntlm cVar6;
  size_t __n;
  bool bVar7;
  connectdata *pcVar8;
  _Bool _Var9;
  CURLcode CVar10;
  statusline sVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  dynbuf *s;
  curl_off_t cVar18;
  char separator;
  char twoorthree [2];
  int httpversion;
  int httpversion_major;
  CURLcode local_80;
  char local_79;
  connectdata *local_78;
  char local_6a [2];
  uint local_68;
  int local_64;
  SingleRequest *local_60;
  int *local_58;
  _Bool *local_50;
  dynbuf *local_48;
  char *local_40;
  ssize_t local_38;
  
  local_60 = &data->req;
  local_38 = *nread;
  local_40 = (data->req).str;
  s = &(data->state).headerb;
  local_58 = &(data->req).httpcode;
  local_78 = conn;
  local_50 = stop_reading;
  local_48 = s;
  do {
    pcVar17 = (data->req).str;
    __n = *nread;
    pvVar14 = memchr(pcVar17,10,__n);
    if (pvVar14 == (void *)0x0) {
      CVar10 = Curl_dyn_addn(s,pcVar17,__n);
      if (CVar10 == CURLE_OK) {
        iVar12 = 2;
        if ((data->req).headerline == 0) {
          pcVar17 = Curl_dyn_ptr(s);
          sVar16 = Curl_dyn_len(s);
          pcVar8 = local_78;
          sVar11 = checkprotoprefix(data,local_78,pcVar17,sVar16);
          if (sVar11 == STATUS_BAD) {
            puVar1 = &(data->req).field_0xd8;
            *puVar1 = *puVar1 & 0xfe;
            (data->req).badheader = HEADER_ALLBAD;
            iVar12 = 2;
            Curl_conncontrol(pcVar8,2);
            if ((*(ulong *)&(data->set).field_0x9a0 & 0x1000000000000000) == 0) {
              Curl_failf(data,"Received HTTP/0.9 when not allowed");
LAB_00126c1b:
              iVar12 = 1;
              local_80 = CURLE_UNSUPPORTED_PROTOCOL;
            }
          }
        }
        goto LAB_00126ff7;
      }
LAB_00126ff3:
      iVar12 = 1;
      local_80 = CVar10;
    }
    else {
      *nread = (ssize_t)(pcVar17 + ~(ulong)pvVar14 + __n);
      (data->req).str = (char *)((long)pvVar14 + 1);
      CVar10 = Curl_dyn_addn(s,pcVar17,((long)pvVar14 + 1) - (long)pcVar17);
      if (CVar10 != CURLE_OK) goto LAB_00126ff3;
      if ((data->req).headerline == 0) {
        pcVar15 = Curl_dyn_ptr(s);
        sVar16 = Curl_dyn_len(s);
        pcVar8 = local_78;
        sVar11 = checkprotoprefix(data,local_78,pcVar15,sVar16);
        iVar12 = 0;
        if (sVar11 == STATUS_BAD) {
          Curl_conncontrol(pcVar8,2);
          if ((*(ulong *)&(data->set).field_0x9a0 & 0x1000000000000000) == 0) {
            Curl_failf(data,"Received HTTP/0.9 when not allowed");
            iVar12 = 1;
            local_80 = CURLE_UNSUPPORTED_PROTOCOL;
          }
          else {
            puVar1 = &(data->req).field_0xd8;
            *puVar1 = *puVar1 & 0xfe;
            if (*nread == 0) {
              (data->req).badheader = HEADER_ALLBAD;
              *nread = local_38;
              (data->req).str = local_40;
              local_80 = CURLE_OK;
              iVar12 = 1;
            }
            else {
              (data->req).badheader = HEADER_PARTHEADER;
              iVar12 = 2;
            }
          }
        }
        s = local_48;
        if (sVar11 == STATUS_BAD) goto LAB_00126ff7;
      }
      pcVar15 = Curl_dyn_ptr(s);
      pcVar8 = local_78;
      if ((*pcVar15 != '\r') && (*pcVar15 != '\n')) {
        iVar12 = (data->req).headerline;
        (data->req).headerline = iVar12 + 1;
        if (iVar12 == 0) {
          uVar5 = local_78->handler->protocol;
          if ((uVar5 & 3) == 0) {
            iVar12 = 0;
            if ((uVar5 >> 0x12 & 1) != 0) {
              iVar12 = 0;
              iVar13 = __isoc99_sscanf(pcVar15," RTSP/%1d.%1d%c%3d",&local_64,&local_68,local_6a,
                                       local_58);
              if ((iVar13 == 4) && (local_6a[0] == ' ')) {
                local_78->httpversion = '\v';
                iVar12 = 4;
              }
            }
LAB_00126f9c:
            if (iVar12 == 0) {
              puVar1 = &(data->req).field_0xd8;
              *puVar1 = *puVar1 & 0xfe;
              iVar12 = 2;
              goto LAB_00126fd3;
            }
            Curl_http_statusline(data,local_78);
            iVar12 = 0;
            bVar7 = true;
          }
          else {
            local_68 = 0;
            iVar12 = __isoc99_sscanf(pcVar15," HTTP/%1d.%1d%c%3d",&local_64,&local_68,&local_79,
                                     local_58);
            if ((iVar12 == 1) && (1 < local_64)) {
              iVar13 = __isoc99_sscanf(pcVar15," HTTP/%1[23] %d",local_6a,local_58);
              iVar12 = 1;
              if (iVar13 == 2) {
                local_78->httpversion = '\0';
                local_79 = ' ';
                iVar12 = 4;
              }
            }
            if ((iVar12 == 4) && (local_79 == ' ')) {
              local_68 = local_64 * 10 + local_68;
              if ((local_68 & 0xfffffffe) == 10) {
                local_78->httpversion = (uchar)local_68;
                if ((local_68 != 0x14) && ((data->req).upgr101 == UPGR101_RECEIVED)) {
                  Curl_infof(data,"Lying server, not serving HTTP/2");
                }
                iVar12 = 4;
                if (local_78->httpversion < 0x14) {
                  local_78->bundle->multiuse = -1;
                  Curl_infof(data,"Mark bundle as not supporting multiuse");
                }
LAB_00126f93:
                bVar7 = true;
              }
              else {
                bVar7 = false;
                Curl_failf(data,"Unsupported HTTP version (%u.%d) in response",
                           (ulong)(uint)((int)local_68 / 10),(ulong)(uint)((int)local_68 % 10));
                local_80 = CURLE_UNSUPPORTED_PROTOCOL;
                iVar12 = 4;
              }
            }
            else {
              if (iVar12 == 0) {
                iVar12 = __isoc99_sscanf(pcVar15," HTTP %3d",local_58);
                local_78->httpversion = '\n';
                if (iVar12 == 0) {
                  pcVar17 = Curl_dyn_ptr(s);
                  sVar16 = Curl_dyn_len(s);
                  sVar11 = checkhttpprefix(data,pcVar17,sVar16);
                  iVar12 = 0;
                  if (sVar11 == STATUS_DONE) {
                    *local_58 = 200;
                    local_78->httpversion = '\n';
                    iVar12 = 1;
                  }
                }
                goto LAB_00126f93;
              }
              bVar7 = false;
              Curl_failf(data,"Unsupported HTTP version in response");
              local_80 = CURLE_UNSUPPORTED_PROTOCOL;
            }
            if (bVar7) goto LAB_00126f9c;
            iVar12 = 1;
LAB_00126fd3:
            bVar7 = false;
          }
          if (!bVar7) goto LAB_00126ff7;
        }
        CVar10 = Curl_http_header(data,local_78,pcVar15);
        if (CVar10 == CURLE_OK) {
          uVar5 = *(uint *)&(data->set).field_0x9a0;
          sVar16 = Curl_dyn_len(s);
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar15,sVar16);
          sVar16 = Curl_dyn_len(s);
          CVar10 = Curl_client_write(data,((uVar5 >> 0x19 & 1) != 0) + 2,pcVar15,sVar16);
          if (CVar10 == CURLE_OK) {
            sVar16 = Curl_dyn_len(s);
            pcVar3 = &(data->info).header_size;
            *pcVar3 = *pcVar3 + sVar16;
            sVar16 = Curl_dyn_len(s);
            pcVar3 = &(data->req).headerbytecount;
            *pcVar3 = *pcVar3 + sVar16;
            Curl_dyn_reset(s);
            iVar12 = 0;
            goto LAB_00126ff7;
          }
        }
        goto LAB_00126ff3;
      }
      uVar5 = (data->req).httpcode;
      if (uVar5 - 100 < 100) {
        if ((char)uVar5 == 'e') {
          if ((data->req).upgr101 == UPGR101_REQUESTED) {
            Curl_infof(data,"Received 101");
            (data->req).upgr101 = UPGR101_RECEIVED;
            puVar1 = &(data->req).field_0xd8;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
            goto LAB_00126c1b;
          }
          puVar1 = &(data->req).field_0xd8;
          *puVar1 = *puVar1 & 0xfe;
        }
        else if ((uVar5 & 0xff) == 100) {
          puVar1 = &(data->req).field_0xd8;
          *puVar1 = *puVar1 | 1;
          (data->req).headerline = 0;
          if ((data->req).exp100 != EXP100_SEND_DATA) {
            (data->req).exp100 = EXP100_SEND_DATA;
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 | 2;
            Curl_expire_done(data,EXPIRE_100_TIMEOUT);
          }
        }
        else {
          puVar1 = &(data->req).field_0xd8;
          *puVar1 = *puVar1 | 1;
          (data->req).headerline = 0;
        }
      }
      else {
        uVar4 = *(ushort *)&(data->req).field_0xd8;
        *(ushort *)&(data->req).field_0xd8 = uVar4 & 0xfffe;
        if (((((uVar4 & 0x20) == 0 && (data->req).size == -1) &&
             (((local_78->bits).field_0x4 & 0x20) == 0)) && (local_78->httpversion == '\v')) &&
           (((local_78->handler->protocol & 0x40000) == 0 && ((data->state).httpreq != HTTPREQ_HEAD)
            ))) {
          Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
          Curl_conncontrol(pcVar8,2);
        }
      }
      if (((pcVar8->bits).field_0x4 & 0x20) != 0) {
        iVar12 = (data->req).httpcode;
        if (iVar12 == 0x197) {
          cVar6 = pcVar8->proxy_ntlm_state;
        }
        else {
          if (iVar12 != 0x191) goto LAB_00126ca3;
          cVar6 = pcVar8->http_ntlm_state;
        }
        if (cVar6 == NTLMSTATE_TYPE2) {
          Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
          puVar1 = &(data->state).field_0x660;
          *puVar1 = *puVar1 | 0x20;
        }
      }
LAB_00126ca3:
      uVar5 = *(uint *)&(data->set).field_0x9a0;
      sVar16 = Curl_dyn_len(s);
      pcVar15 = Curl_dyn_ptr(s);
      CVar10 = Curl_client_write(data,((uVar5 >> 0x19 & 1) != 0) + 2,pcVar15,sVar16);
      if (CVar10 != CURLE_OK) goto LAB_00126ff3;
      pcVar3 = &(data->info).header_size;
      *pcVar3 = *pcVar3 + sVar16;
      cVar18 = (data->req).headerbytecount + sVar16;
      (data->req).headerbytecount = cVar18;
      _Var9 = http_should_fail(data);
      if (_Var9) {
        Curl_failf(data,"The requested URL returned error: %d");
        local_80 = CURLE_HTTP_RETURNED_ERROR;
        iVar12 = 1;
      }
      else {
        if (99 < (data->req).httpcode - 100U) {
          cVar18 = 0;
        }
        (data->req).deductheadercount = cVar18;
        CVar10 = Curl_http_auth_act(data);
        if (CVar10 != CURLE_OK) goto LAB_00126ff3;
        if (299 < (data->req).httpcode) {
          if ((((*(uint *)&(local_78->bits).field_0x4 & 0x60020) == 0) &&
              ((data->state).httpreq - HTTPREQ_POST < 4)) &&
             (Curl_expire_done(data,EXPIRE_100_TIMEOUT), ((data->req).field_0xd8 & 4) == 0)) {
            if (((data->req).httpcode == 0x1a1) && (((data->state).field_0x661 & 1) != 0)) {
              Curl_infof(data,"Got 417 while waiting for a 100");
              puVar1 = &(data->state).field_0x661;
              *puVar1 = *puVar1 | 2;
              pcVar15 = (*Curl_cstrdup)((data->state).url);
              (data->req).newurl = pcVar15;
              Curl_done_sending(data,local_60);
            }
            else if (((data->set).field_0x9a2 & 0x20) == 0) {
              Curl_infof(data,"HTTP error before end of send, stop sending");
              Curl_conncontrol(local_78,2);
              CVar10 = Curl_done_sending(data,local_60);
              if (CVar10 != CURLE_OK) goto LAB_00126ff3;
              puVar1 = &(data->req).field_0xd8;
              *puVar1 = *puVar1 | 4;
              if (((data->state).field_0x661 & 1) != 0) {
                (data->req).exp100 = EXP100_FAILED;
              }
            }
            else {
              Curl_infof(data,"HTTP error before end of send, keep sending");
              if ((data->req).exp100 != EXP100_SEND_DATA) {
                (data->req).exp100 = EXP100_SEND_DATA;
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 | 2;
              }
            }
          }
          if (((local_78->bits).field_0x6 & 4) != 0) {
            Curl_infof(data,"Keep sending data to get tossed away!");
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 | 2;
          }
        }
        uVar4 = *(ushort *)&(data->req).field_0xd8;
        if ((uVar4 & 1) == 0) {
          if ((((data->set).field_0x9a3 & 0x10) == 0) &&
             ((((local_78->handler->protocol & 0x40000) == 0 ||
               ((data->set).rtspreq != RTSPREQ_DESCRIBE)) || (-1 < local_60->size)))) {
            if ((uVar4 & 0x20) != 0) {
              *(undefined4 *)&local_60->size = 0xffffffff;
              *(undefined4 *)((long)&local_60->size + 4) = 0xffffffff;
              *(undefined4 *)&local_60->maxdownload = 0xffffffff;
              *(undefined4 *)((long)&local_60->maxdownload + 4) = 0xffffffff;
            }
          }
          else {
            *local_50 = true;
          }
          if (local_60->size != -1) {
            Curl_pgrsSetDownloadSize(data,local_60->size);
            (data->req).maxdownload = (data->req).size;
          }
          if ((data->req).maxdownload == 0) {
            *local_50 = true;
          }
          if (*local_50 == true) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          }
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar17,sVar16);
          iVar12 = 2;
        }
        else {
          Curl_dyn_reset(s);
          iVar12 = 3;
        }
      }
    }
LAB_00126ff7:
    if ((iVar12 != 0) && (iVar12 != 3)) {
      if (iVar12 == 2) {
        return CURLE_OK;
      }
      return local_80;
    }
    if (*(data->req).str == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     ssize_t *nread,
                                     bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;
  char *headp;
  char *str_start;
  char *end_ptr;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    end_ptr = memchr(str_start, 0x0a, *nread);

    if(!end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = Curl_dyn_addn(&data->state.headerb, str_start, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st =
          checkprotoprefix(data, conn,
                           Curl_dyn_ptr(&data->state.headerb),
                           Curl_dyn_len(&data->state.headerb));

        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = end_ptr + 1; /* move past new line */

    full_length = k->str - str_start;

    result = Curl_dyn_addn(&data->state.headerb, str_start, full_length);
    if(result)
      return result;

    /****
     * We now have a FULL header line in 'headerb'.
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       Curl_dyn_len(&data->state.headerb));
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so use 0x0a and 0x0d instead of '\n'
       and '\r' */
    headp = Curl_dyn_ptr(&data->state.headerb);
    if((0x0a == *headp) || (0x0d == *headp)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

#ifdef CURL_DOES_CONVERSIONS
      if(0x0d == *headp) {
        *headp = '\r'; /* replace with CR in host encoding */
        headp++;       /* pass the CR byte */
      }
      if(0x0a == *headp) {
        *headp = '\n'; /* replace with LF in host encoding */
        headp++;       /* pass the LF byte */
      }
#else
      if('\r' == *headp)
        headp++; /* pass the \r byte */
      if('\n' == *headp)
        headp++; /* pass the \n byte */
#endif /* CURL_DOES_CONVERSIONS */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_REQUESTED) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(data, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
          else {
            /* Switching to another protocol (e.g. WebSocket) */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->state.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER;
      if(data->set.include_header)
        writetype |= CLIENTWRITE_BODY;

      headerlen = Curl_dyn_len(&data->state.headerb);
      result = Curl_client_write(data, writetype,
                                 Curl_dyn_ptr(&data->state.headerb),
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(data)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(data);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->state.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if((k->httpcode == 417) && data->state.expect100header) {
                /* 417 Expectation Failed - try again without the Expect
                   header */
                infof(data, "Got 417 while waiting for a 100");
                data->state.disableexpect = TRUE;
                DEBUGASSERT(!data->req.newurl);
                data->req.newurl = strdup(data->state.url);
                Curl_done_sending(data, k);
              }
              else if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending");
                streamclose(conn, "Stop sending data before everything sent");
                result = Curl_done_sending(data, k);
                if(result)
                  return result;
                k->upload_done = TRUE;
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away!");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif
        else {
          /* If we know the expected size of this document, we set the
             maximum download size to the size of the expected
             document or else, we won't know when to stop reading!

             Note that we set the download maximum even if we read a
             "Connection: close" header, to make sure that
             "Content-Length: 0" still prevents us from attempting to
             read the (missing) response-body.
          */
          /* According to RFC2616 section 4.4, we MUST ignore
             Content-Length: headers if we are now receiving data
             using chunked Transfer-Encoding.
          */
          if(k->chunk)
            k->maxdownload = k->size = -1;
        }
        if(-1 != k->size) {
          /* We do this operation even if no_body is true, since this
             data might be retrieved later with curl_easy_getinfo()
             and its CURLINFO_CONTENT_LENGTH_DOWNLOAD option. */

          Curl_pgrsSetDownloadSize(data, k->size);
          k->maxdownload = k->size;
        }

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        Curl_debug(data, CURLINFO_HEADER_IN, str_start, headerlen);
        break; /* exit header line loop */
      }

      /* We continue reading headers, reset the line-based header */
      Curl_dyn_reset(&data->state.headerb);
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#ifdef CURL_DOES_CONVERSIONS
#define HEADER1 scratch
#define SCRATCHSIZE 21
      CURLcode res;
      char scratch[SCRATCHSIZE + 1]; /* "HTTP/major.minor 123" */
      /* We can't really convert this yet because we don't know if it's the
         1st header line or the body.  So we do a partial conversion into a
         scratch area, leaving the data at 'headp' as-is.
      */
      strncpy(&scratch[0], headp, SCRATCHSIZE);
      scratch[SCRATCHSIZE] = 0; /* null terminate */
      res = Curl_convert_from_network(data,
                                      &scratch[0],
                                      SCRATCHSIZE);
      if(res)
        /* Curl_convert_from_network calls failf if unsuccessful */
        return res;
#else
#define HEADER1 headp /* no conversion needed, just use headp */
#endif /* CURL_DOES_CONVERSIONS */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://tools.ietf.org/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We try to allow any number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        char twoorthree[2];
        int httpversion = 0;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d",
                    &httpversion_major,
                    &httpversion,
                    &separator,
                    &k->httpcode);

        if(nc == 1 && httpversion_major >= 2 &&
           2 == sscanf(HEADER1, " HTTP/%1[23] %d", twoorthree, &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        if((nc == 4) && (' ' == separator)) {
          httpversion += 10 * httpversion_major;
          switch(httpversion) {
          case 10:
          case 11:
#if defined(USE_NGHTTP2) || defined(USE_HYPER)
          case 20:
#endif
#if defined(ENABLE_QUIC)
          case 30:
#endif
            conn->httpversion = (unsigned char)httpversion;
            break;
          default:
            failf(data, "Unsupported HTTP version (%u.%d) in response",
                  httpversion/10, httpversion%10);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            statusline check =
              checkhttpprefix(data,
                              Curl_dyn_ptr(&data->state.headerb),
                              Curl_dyn_len(&data->state.headerb));
            if(check == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        int rtspversion;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        result = Curl_http_statusline(data, conn);
        if(result)
          return result;
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = Curl_convert_from_network(data, headp, strlen(headp));
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

    result = Curl_http_header(data, conn, headp);
    if(result)
      return result;

    /*
     * End of header-checks. Write them to the client.
     */

    writetype = CLIENTWRITE_HEADER;
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;

    Curl_debug(data, CURLINFO_HEADER_IN, headp,
               Curl_dyn_len(&data->state.headerb));

    result = Curl_client_write(data, writetype, headp,
                               Curl_dyn_len(&data->state.headerb));
    if(result)
      return result;

    data->info.header_size += Curl_dyn_len(&data->state.headerb);
    data->req.headerbytecount += Curl_dyn_len(&data->state.headerb);

    Curl_dyn_reset(&data->state.headerb);
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}